

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O0

bool __thiscall
Assimp::MDLImporter::CanRead(MDLImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  long lVar2;
  undefined4 local_88;
  undefined4 local_84;
  uint32_t tokens [8];
  undefined1 local_50 [8];
  string extension;
  bool checkSig_local;
  IOSystem *pIOHandler_local;
  string *pFile_local;
  MDLImporter *this_local;
  
  extension.field_2._M_local_buf[0xf] = checkSig;
  BaseImporter::GetExtension((string *)local_50,pFile);
  bVar1 = std::operator==((string *)local_50,"mdl");
  if (!bVar1) {
    lVar2 = std::__cxx11::string::length();
    if ((lVar2 != 0) && ((extension.field_2._M_local_buf[0xf] & 1U) == 0)) {
      this_local._7_1_ = false;
      goto LAB_00712805;
    }
  }
  local_88 = 0x54534449;
  local_84 = 0x51534449;
  tokens[0] = 0x374c444d;
  tokens[1] = 0x354c444d;
  tokens[2] = 0x344c444d;
  tokens[3] = 0x334c444d;
  tokens[4] = 0x324c444d;
  tokens[5] = 0x4f504449;
  this_local._7_1_ = BaseImporter::CheckMagicToken(pIOHandler,pFile,&local_88,8,0,4);
LAB_00712805:
  std::__cxx11::string::~string((string *)local_50);
  return this_local._7_1_;
}

Assistant:

bool MDLImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const {
    const std::string extension = GetExtension(pFile);

    // if check for extension is not enough, check for the magic tokens
    if (extension == "mdl"  || !extension.length() || checkSig) {
        uint32_t tokens[8];
        tokens[0] = AI_MDL_MAGIC_NUMBER_LE_HL2a;
        tokens[1] = AI_MDL_MAGIC_NUMBER_LE_HL2b;
        tokens[2] = AI_MDL_MAGIC_NUMBER_LE_GS7;
        tokens[3] = AI_MDL_MAGIC_NUMBER_LE_GS5b;
        tokens[4] = AI_MDL_MAGIC_NUMBER_LE_GS5a;
        tokens[5] = AI_MDL_MAGIC_NUMBER_LE_GS4;
        tokens[6] = AI_MDL_MAGIC_NUMBER_LE_GS3;
        tokens[7] = AI_MDL_MAGIC_NUMBER_LE;
        return CheckMagicToken(pIOHandler,pFile,tokens,8,0);
    }
    return false;
}